

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O1

void printPCRelImm(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_mode cVar3;
  cs_detail *pcVar4;
  cs_struct *h;
  _Bool _Var5;
  uint8_t uVar6;
  uint id;
  MCOperand *op;
  int64_t iVar7;
  undefined4 in_register_00000034;
  ulong uVar8;
  ulong imm;
  uint8_t access [6];
  uint8_t local_2e [6];
  
  op = MCInst_getOperand(MI,0);
  _Var5 = MCOperand_isImm(op);
  if (_Var5) {
    iVar7 = MCOperand_getImm(op);
    uVar8 = (ulong)MI->flat_insn->size + iVar7 + MI->address;
    uVar6 = X86_immediate_size(MI->Opcode,(uint8_t *)0x0);
    cVar3 = MI->csh->mode;
    imm = uVar8 & 0xffffffff;
    if (cVar3 == CS_MODE_64) {
      imm = uVar8;
    }
    if (((cVar3 == CS_MODE_16) && (MI->Opcode != 0x169)) && (MI->Opcode != 0x460)) {
      imm = imm & 0xffff;
    }
    if (((cVar3 == CS_MODE_16) && (MI->Opcode == 0x460)) && (MI->x86_prefix[2] != 'f')) {
      imm = imm & 0xffff;
    }
    if ((MI->Opcode == 0x45f) || (MI->Opcode == 0x168)) {
      imm = imm & 0xffff;
    }
    printImm(MI,(SStream *)CONCAT44(in_register_00000034,OpNo),imm,true);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar4 = MI->flat_insn->detail;
      puVar1 = pcVar4->groups + (ulong)((uint)(pcVar4->field_6).x86.op_count * 0x30) + 0x55;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar4 = MI->flat_insn->detail;
      bVar2 = (pcVar4->field_6).x86.op_count;
      if (bVar2 == 0) {
        if (uVar6 == '\0') {
          uVar6 = MI->imm_size;
        }
      }
      else {
        uVar6 = *(uint8_t *)((long)&pcVar4->field_6 + 0x68);
      }
      pcVar4->groups[(ulong)((uint)bVar2 * 0x30) + 0x75] = uVar6;
      pcVar4 = MI->flat_insn->detail;
      *(ulong *)(pcVar4->groups + (ulong)((uint)(pcVar4->field_6).x86.op_count * 0x30) + 0x5d) = imm
      ;
      h = MI->csh;
      id = MCInst_getOpcode(MI);
      get_op_access(h,id,local_2e,&(MI->flat_insn->detail->field_6).x86.field_15.eflags);
      pcVar4 = MI->flat_insn->detail;
      bVar2 = (pcVar4->field_6).x86.op_count;
      pcVar4->groups[(ulong)((uint)bVar2 * 0x30) + 0x76] = local_2e[bVar2];
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
    if (MI->op1_size == '\0') {
      MI->op1_size = MI->imm_size;
    }
  }
  return;
}

Assistant:

static void printPCRelImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op) + MI->flat_insn->size + MI->address;

		// truncat imm for non-64bit
		if (MI->csh->mode != CS_MODE_64) {
			imm = imm & 0xffffffff;
		}

		if (MI->csh->mode == CS_MODE_16 &&
				(MI->Opcode != X86_JMP_4 && MI->Opcode != X86_CALLpcrel32))
			imm = imm & 0xffff;

		// Hack: X86 16bit with opcode X86_JMP_4
		if (MI->csh->mode == CS_MODE_16 &&
				(MI->Opcode == X86_JMP_4 && MI->x86_prefix[2] != 0x66))
			imm = imm & 0xffff;

		// CALL/JMP rel16 is special
		if (MI->Opcode == X86_CALLpcrel16 || MI->Opcode == X86_JMP_2)
			imm = imm & 0xffff;

		if (imm < 0) {
			SStream_concat(O, "0x%"PRIx64, imm);
		} else {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%"PRIx64, imm);
			else
				SStream_concat(O, "%"PRIu64, imm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
			MI->has_imm = true;
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;
			MI->flat_insn->detail->x86.op_count++;
		}
	}
}